

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

OPEN_HANDLE open_clone(OPEN_HANDLE value)

{
  OPEN_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (OPEN_HANDLE)malloc(8);
  if (__ptr != (OPEN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (OPEN_HANDLE)0x0;
}

Assistant:

OPEN_HANDLE open_clone(OPEN_HANDLE value)
{
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)malloc(sizeof(OPEN_INSTANCE));
    if (open_instance != NULL)
    {
        open_instance->composite_value = amqpvalue_clone(((OPEN_INSTANCE*)value)->composite_value);
        if (open_instance->composite_value == NULL)
        {
            free(open_instance);
            open_instance = NULL;
        }
    }

    return open_instance;
}